

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAndiRg<(moira::Instr)60,(moira::Mode)0,(moira::Size)1>(Moira *this,u16 opcode)

{
  u32 uVar1;
  
  uVar1 = readI<(moira::Size)1>(this);
  uVar1 = logic<(moira::Instr)60,(moira::Size)1>
                    (this,uVar1,(uint)*(byte *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58))
  ;
  prefetch<4ul>(this);
  *(char *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = (char)uVar1;
  return;
}

Assistant:

void
Moira::execAndiRg(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 result = logic<I,S>(src, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(4);
    writeD<S>(dst, result);
}